

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  TokenList *args_1;
  SyntaxNode *args_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3;
  DataDeclarationSyntax *pDVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = deepClone((TokenList *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x90),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 200),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,args_1,(DataTypeSyntax *)args_2,args_3,
                      &local_40);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DataDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DataDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.modifiers, alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}